

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndelLengthDistribution.cpp
# Opt level: O0

void __thiscall
IndelLengthDistribution::IndelLengthDistribution
          (IndelLengthDistribution *this,HistogramBasedDistribution *distribution)

{
  int iVar1;
  HistogramBasedDistribution *in_RSI;
  HistogramBasedDistribution *in_RDI;
  double dVar2;
  int phred;
  int i;
  int iVar3;
  undefined4 local_14;
  HistogramBasedDistribution *this_00;
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2b0bad);
  local_14 = 0;
  while( true ) {
    iVar3 = local_14;
    iVar1 = HistogramBasedDistribution::maxValue(in_RSI);
    if (iVar1 < iVar3) break;
    dVar2 = HistogramBasedDistribution::probability(this_00,(int)((ulong)in_RSI >> 0x20));
    dVar2 = log10(dVar2);
    round(dVar2 * -10.0);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_RDI,
               (value_type_conflict2 *)CONCAT44(iVar1,iVar3));
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

IndelLengthDistribution::IndelLengthDistribution(const HistogramBasedDistribution& distribution) {
	for (int i=0; i<=distribution.maxValue(); ++i) {
		int phred = (int)round(-log10(distribution.probability(i))*10.0);
		phred_costs.push_back(phred);
	}
}